

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

int __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
find(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
    ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar1;
  bool bVar2;
  int iVar3;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar4;
  int iVar5;
  
  iVar5 = 0;
  pAVar4 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&this->root;
  while( true ) {
    pAVar1 = pAVar4->right;
    if (pAVar1 == (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0) {
      return -1;
    }
    bVar2 = std::operator!=(&pAVar1->value,value);
    if (!bVar2) break;
    bVar2 = std::operator>(&pAVar1->value,value);
    pAVar4 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pAVar1->left;
    if (!bVar2) {
      pAVar4 = pAVar1->left;
      iVar3 = 1;
      if (pAVar4 != (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        iVar3 = pAVar4->count + 1;
      }
      iVar5 = iVar5 + iVar3;
      pAVar4 = pAVar1;
    }
  }
  if (pAVar1->left ==
      (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = pAVar1->left->count;
  }
  return iVar3 + iVar5;
}

Assistant:

int AVLTree<T>::find(T value) const {
    AVLTreeNode<T> *direct = root;
    int idx = 0;

    while (direct != nullptr and direct->value != value) {
      if (direct->value > value) {
        direct = direct->left;
      } else {
        idx += (direct->left ? direct->left->count : 0) + 1;
        direct = direct->right;
      }
    }

    if (direct == nullptr) {
      return -1;
    }
    return idx + (direct->left ? direct->left->count : 0);
  }